

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O0

int rhsQ(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector qdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *user_data_local;
  N_Vector qdot_local;
  N_Vector yp_local;
  N_Vector yy_local;
  sunrealtype t_local;
  
  dVar1 = **(double **)((long)yy->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)yy->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x10);
  **(double **)((long)qdot->content + 0x10) = (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 0.5;
  return 0;
}

Assistant:

static int rhsQ(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector qdot,
                void* user_data)
{
  sunrealtype y1, y2, y3;

  y1           = Ith(yy, 1);
  y2           = Ith(yy, 2);
  y3           = Ith(yy, 3);
  Ith(qdot, 1) = HALF * (y1 * y1 + y2 * y2 + y3 * y3);

  return (0);
}